

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::copy
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  pointer pCVar2;
  long lVar3;
  byte *pbVar4;
  int iVar5;
  long lVar6;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar4 = (byte *)(*(long *)(*(long *)dst + 8) + 3U & 0xfffffffffffffffc);
  if (*(byte **)(dst + 8) < pbVar4 + sVar1 * 8) {
    pbVar4 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 << 3,4);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar4 + sVar1 * 8;
  }
  sVar1 = this->len;
  if (sVar1 != 0) {
    pCVar2 = this->data_;
    iVar5 = 0;
    lVar6 = 0;
    do {
      pbVar4[lVar6] = 1;
      *(undefined4 *)(pbVar4 + lVar6 + 4) = *(undefined4 *)((long)&pCVar2->value + lVar6);
      iVar5 = iVar5 + -1;
      if (sVar1 * 8 + -8 == lVar6) break;
      lVar3 = lVar6 + 8;
      lVar6 = lVar6 + 8;
    } while (pbVar4 + lVar3 != pbVar4 + sVar1 * 8);
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls - iVar5;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls - iVar5;
  }
  return (int)pbVar4;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }